

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

lua_Number numarith(lua_State *L,int op,lua_Number v1,lua_Number v2)

{
  ulong uVar1;
  double dVar2;
  lua_Number lVar3;
  
  switch((ulong)L & 0xffffffff) {
  case 0:
    lVar3 = v1 + v2;
    break;
  case 1:
    lVar3 = v1 - v2;
    break;
  case 2:
    lVar3 = v1 * v2;
    break;
  case 3:
    dVar2 = fmod(v1,v2);
    uVar1 = -(ulong)(dVar2 * v2 < 0.0);
    return (lua_Number)(~uVar1 & (ulong)dVar2 | (ulong)(v2 + dVar2) & uVar1);
  case 4:
    dVar2 = pow(v1,v2);
    return dVar2;
  case 5:
    lVar3 = v1 / v2;
    break;
  case 6:
    dVar2 = floor(v1 / v2);
    return dVar2;
  default:
    return 0.0;
  case 0xc:
    lVar3 = -v1;
  }
  return lVar3;
}

Assistant:

static lua_Number numarith (lua_State *L, int op, lua_Number v1,
                                                  lua_Number v2) {
  switch (op) {
    case LUA_OPADD: return luai_numadd(L, v1, v2);
    case LUA_OPSUB: return luai_numsub(L, v1, v2);
    case LUA_OPMUL: return luai_nummul(L, v1, v2);
    case LUA_OPDIV: return luai_numdiv(L, v1, v2);
    case LUA_OPPOW: return luai_numpow(L, v1, v2);
    case LUA_OPIDIV: return luai_numidiv(L, v1, v2);
    case LUA_OPUNM: return luai_numunm(L, v1);
    case LUA_OPMOD: {
      lua_Number m;
      luai_nummod(L, v1, v2, m);
      return m;
    }
    default: lua_assert(0); return 0;
  }
}